

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

BrotliDecoderErrorCode
DecodeContextMap(uint32_t context_map_size,uint32_t *num_htrees,uint8_t **context_map_arg,
                BrotliDecoderStateInternal *s)

{
  BrotliBitReader *br;
  HuffmanCode *table;
  uint uVar1;
  byte *pbVar2;
  BrotliDecoderErrorCode BVar3;
  uint8_t *puVar4;
  ulong uVar5;
  uint32_t uVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  HuffmanCode *pHVar10;
  ulong uVar11;
  uint32_t uVar12;
  uint uVar13;
  uint64_t uVar14;
  uint uVar15;
  BrotliRunningContextMapState BVar16;
  bool bVar17;
  uint32_t code;
  uint local_44;
  uint8_t **local_40;
  uint32_t local_34;
  
  BVar16 = (s->arena).header.substate_context_map;
  if (BROTLI_STATE_CONTEXT_MAP_TRANSFORM < BVar16) {
    return BROTLI_DECODER_ERROR_UNREACHABLE;
  }
  br = &s->br;
  local_40 = context_map_arg;
  switch(BVar16) {
  case BROTLI_STATE_CONTEXT_MAP_NONE:
    BVar3 = DecodeVarLenUint8(s,br,num_htrees);
    if (BVar3 != BROTLI_DECODER_SUCCESS) {
      return BVar3;
    }
    *num_htrees = *num_htrees + 1;
    (s->arena).header.context_index = 0;
    puVar4 = (uint8_t *)(*s->alloc_func)(s->memory_manager_opaque,(ulong)context_map_size);
    *local_40 = puVar4;
    if (puVar4 == (uint8_t *)0x0) {
      return BROTLI_DECODER_ERROR_ALLOC_CONTEXT_MAP;
    }
    if (*num_htrees < 2) {
      memset(puVar4,0,(ulong)context_map_size);
      return BROTLI_DECODER_SUCCESS;
    }
    (s->arena).header.substate_context_map = BROTLI_STATE_CONTEXT_MAP_READ_PREFIX;
  case BROTLI_STATE_CONTEXT_MAP_READ_PREFIX:
    uVar6 = (s->br).bit_pos_;
    if (uVar6 - 0x3c < 5) {
      sVar9 = (s->br).avail_in;
      if (sVar9 == 0) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      uVar11 = (s->br).val_;
      pbVar2 = (s->br).next_in;
      (s->br).val_ = uVar11 >> 8;
      uVar14 = (ulong)*pbVar2 << 0x38 | uVar11 >> 8;
      (s->br).val_ = uVar14;
      uVar6 = uVar6 - 8;
      (s->br).avail_in = sVar9 - 1;
      (s->br).next_in = pbVar2 + 1;
    }
    else {
      uVar14 = br->val_;
    }
    uVar15 = (uint)(uVar14 >> ((byte)uVar6 & 0x3f));
    uVar13 = uVar15 & 1;
    uVar12 = (uVar15 >> 1 & 0xf) + 1 & -uVar13;
    (s->arena).header.max_run_length_prefix = uVar12;
    (s->br).bit_pos_ = uVar6 + uVar13 * 4 + 1;
    (s->arena).header.substate_context_map = BROTLI_STATE_CONTEXT_MAP_HUFFMAN;
    break;
  case BROTLI_STATE_CONTEXT_MAP_HUFFMAN:
    uVar12 = (s->arena).header.max_run_length_prefix;
    break;
  case BROTLI_STATE_CONTEXT_MAP_DECODE:
    uVar13 = (s->arena).header.code;
    goto LAB_00103c64;
  case BROTLI_STATE_CONTEXT_MAP_TRANSFORM:
    goto switchD_00103b1d_caseD_4;
  }
  BVar3 = ReadHuffmanCode(uVar12 + *num_htrees,uVar12 + *num_htrees,
                          (s->arena).header.context_map_table,(uint32_t *)0x0,s);
  if (BVar3 != BROTLI_DECODER_SUCCESS) {
    return BVar3;
  }
  (s->arena).header.code = 0xffff;
  (s->arena).header.substate_context_map = BROTLI_STATE_CONTEXT_MAP_DECODE;
  uVar13 = 0xffff;
LAB_00103c64:
  uVar15 = (s->arena).header.context_index;
  uVar1 = (s->arena).header.max_run_length_prefix;
  puVar4 = *local_40;
  bVar17 = uVar13 != 0xffff;
  local_44 = uVar13;
  if (uVar15 < context_map_size || bVar17) {
    table = (s->arena).header.context_map_table;
    do {
      uVar12 = (s->br).bit_pos_;
      if (bVar17) {
LAB_00103da2:
        uVar8 = 0x40 - uVar12;
        if (uVar8 < uVar13) {
          sVar9 = (s->br).avail_in;
          do {
            sVar9 = sVar9 - 1;
            if (sVar9 == 0xffffffffffffffff) {
LAB_00103eed:
              (s->arena).header.code = uVar13;
              (s->arena).header.context_index = uVar15;
              return BROTLI_DECODER_NEEDS_MORE_INPUT;
            }
            uVar11 = (s->br).val_;
            pbVar2 = (s->br).next_in;
            (s->br).val_ = uVar11 >> 8;
            uVar14 = (ulong)*pbVar2 << 0x38 | uVar11 >> 8;
            (s->br).val_ = uVar14;
            uVar12 = uVar12 - 8;
            (s->br).bit_pos_ = uVar12;
            (s->br).avail_in = sVar9;
            (s->br).next_in = pbVar2 + 1;
            uVar8 = uVar8 + 8;
          } while (uVar8 < uVar13);
        }
        else {
          uVar14 = br->val_;
        }
        uVar8 = kBitMask[uVar13];
        (s->br).bit_pos_ = uVar12 + uVar13;
        iVar7 = (1 << ((byte)uVar13 & 0x1f)) + ((uint)(uVar14 >> ((byte)uVar12 & 0x3f)) & uVar8);
        if (context_map_size < iVar7 + uVar15) {
          return BROTLI_DECODER_ERROR_FORMAT_CONTEXT_MAP_REPEAT;
        }
        do {
          uVar11 = (ulong)uVar15;
          uVar15 = uVar15 + 1;
          puVar4[uVar11] = '\0';
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
      }
      else {
        if (uVar12 - 0x32 < 0xf) {
          sVar9 = (s->br).avail_in;
          uVar6 = uVar12;
          do {
            sVar9 = sVar9 - 1;
            if (sVar9 == 0xffffffffffffffff) {
              local_34 = context_map_size;
              iVar7 = SafeDecodeSymbol(table,br,&local_44);
              context_map_size = local_34;
              if (iVar7 != 0) goto LAB_00103d8c;
              uVar13 = 0xffff;
              goto LAB_00103eed;
            }
            uVar11 = (s->br).val_;
            pbVar2 = (s->br).next_in;
            (s->br).val_ = uVar11 >> 8;
            uVar11 = (ulong)*pbVar2 << 0x38 | uVar11 >> 8;
            (s->br).val_ = uVar11;
            uVar12 = uVar6 - 8;
            (s->br).bit_pos_ = uVar12;
            (s->br).avail_in = sVar9;
            (s->br).next_in = pbVar2 + 1;
            uVar13 = uVar6 - 0x3a;
            uVar6 = uVar12;
          } while (uVar13 < 0xf);
        }
        else {
          uVar11 = br->val_;
        }
        uVar11 = uVar11 >> ((byte)uVar12 & 0x3f);
        pHVar10 = table + (uVar11 & 0xff);
        uVar13 = (uint)pHVar10->bits;
        if (8 < uVar13) {
          uVar12 = uVar12 + 8;
          pHVar10 = pHVar10 + (((uint)(uVar11 >> 8) & 0xffffff & kBitMask[pHVar10->bits - 8] & 0x7f)
                              + (uint)pHVar10->value);
          uVar13 = (uint)pHVar10->bits;
        }
        (s->br).bit_pos_ = uVar13 + uVar12;
        local_44 = (uint)pHVar10->value;
LAB_00103d8c:
        if (local_44 == 0) {
          iVar7 = 0;
          uVar13 = 0;
        }
        else {
          iVar7 = local_44 - uVar1;
          uVar13 = local_44;
          if (local_44 < uVar1 || iVar7 == 0) {
            uVar12 = (s->br).bit_pos_;
            goto LAB_00103da2;
          }
        }
        uVar11 = (ulong)uVar15;
        uVar15 = uVar15 + 1;
        puVar4[uVar11] = (uint8_t)iVar7;
      }
      bVar17 = false;
    } while (uVar15 < context_map_size);
  }
switchD_00103b1d_caseD_4:
  uVar13 = (s->br).bit_pos_;
  uVar11 = (ulong)uVar13;
  if (uVar13 == 0x40) {
    sVar9 = (s->br).avail_in;
    if (sVar9 == 0) {
      BVar3 = BROTLI_DECODER_NEEDS_MORE_INPUT;
      BVar16 = BROTLI_STATE_CONTEXT_MAP_TRANSFORM;
      goto LAB_00103ed7;
    }
    uVar11 = (s->br).val_;
    pbVar2 = (s->br).next_in;
    (s->br).val_ = uVar11 >> 8;
    uVar5 = (ulong)*pbVar2 << 0x38 | uVar11 >> 8;
    (s->br).val_ = uVar5;
    (s->br).avail_in = sVar9 - 1;
    (s->br).next_in = pbVar2 + 1;
    uVar11 = 0x38;
  }
  else {
    uVar5 = br->val_;
  }
  (s->br).bit_pos_ = (int)uVar11 + 1;
  BVar3 = BROTLI_DECODER_SUCCESS;
  BVar16 = BROTLI_STATE_CONTEXT_MAP_NONE;
  if ((uVar5 >> (uVar11 & 0x3f) & 1) != 0) {
    InverseMoveToFrontTransform(*local_40,context_map_size,s);
  }
LAB_00103ed7:
  (s->arena).header.substate_context_map = BVar16;
  return BVar3;
}

Assistant:

static BrotliDecoderErrorCode DecodeContextMap(uint32_t context_map_size,
                                               uint32_t* num_htrees,
                                               uint8_t** context_map_arg,
                                               BrotliDecoderState* s) {
  BrotliBitReader* br = &s->br;
  BrotliDecoderErrorCode result = BROTLI_DECODER_SUCCESS;
  BrotliMetablockHeaderArena* h = &s->arena.header;

  switch ((int)h->substate_context_map) {
    case BROTLI_STATE_CONTEXT_MAP_NONE:
      result = DecodeVarLenUint8(s, br, num_htrees);
      if (result != BROTLI_DECODER_SUCCESS) {
        return result;
      }
      (*num_htrees)++;
      h->context_index = 0;
      BROTLI_LOG_UINT(context_map_size);
      BROTLI_LOG_UINT(*num_htrees);
      *context_map_arg =
          (uint8_t*)BROTLI_DECODER_ALLOC(s, (size_t)context_map_size);
      if (*context_map_arg == 0) {
        return BROTLI_FAILURE(BROTLI_DECODER_ERROR_ALLOC_CONTEXT_MAP);
      }
      if (*num_htrees <= 1) {
        memset(*context_map_arg, 0, (size_t)context_map_size);
        return BROTLI_DECODER_SUCCESS;
      }
      h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_READ_PREFIX;
    /* Fall through. */

    case BROTLI_STATE_CONTEXT_MAP_READ_PREFIX: {
      uint32_t bits;
      /* In next stage ReadHuffmanCode uses at least 4 bits, so it is safe
         to peek 4 bits ahead. */
      if (!BrotliSafeGetBits(br, 5, &bits)) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if ((bits & 1) != 0) { /* Use RLE for zeros. */
        h->max_run_length_prefix = (bits >> 1) + 1;
        BrotliDropBits(br, 5);
      } else {
        h->max_run_length_prefix = 0;
        BrotliDropBits(br, 1);
      }
      BROTLI_LOG_UINT(h->max_run_length_prefix);
      h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_HUFFMAN;
    }
    /* Fall through. */

    case BROTLI_STATE_CONTEXT_MAP_HUFFMAN: {
      uint32_t alphabet_size = *num_htrees + h->max_run_length_prefix;
      result = ReadHuffmanCode(alphabet_size, alphabet_size,
                               h->context_map_table, NULL, s);
      if (result != BROTLI_DECODER_SUCCESS) return result;
      h->code = 0xFFFF;
      h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_DECODE;
    }
    /* Fall through. */

    case BROTLI_STATE_CONTEXT_MAP_DECODE: {
      uint32_t context_index = h->context_index;
      uint32_t max_run_length_prefix = h->max_run_length_prefix;
      uint8_t* context_map = *context_map_arg;
      uint32_t code = h->code;
      BROTLI_BOOL skip_preamble = (code != 0xFFFF);
      while (context_index < context_map_size || skip_preamble) {
        if (!skip_preamble) {
          if (!SafeReadSymbol(h->context_map_table, br, &code)) {
            h->code = 0xFFFF;
            h->context_index = context_index;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          BROTLI_LOG_UINT(code);

          if (code == 0) {
            context_map[context_index++] = 0;
            continue;
          }
          if (code > max_run_length_prefix) {
            context_map[context_index++] =
                (uint8_t)(code - max_run_length_prefix);
            continue;
          }
        } else {
          skip_preamble = BROTLI_FALSE;
        }
        /* RLE sub-stage. */
        {
          uint32_t reps;
          if (!BrotliSafeReadBits(br, code, &reps)) {
            h->code = code;
            h->context_index = context_index;
            return BROTLI_DECODER_NEEDS_MORE_INPUT;
          }
          reps += 1U << code;
          BROTLI_LOG_UINT(reps);
          if (context_index + reps > context_map_size) {
            return
                BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_CONTEXT_MAP_REPEAT);
          }
          do {
            context_map[context_index++] = 0;
          } while (--reps);
        }
      }
    }
    /* Fall through. */

    case BROTLI_STATE_CONTEXT_MAP_TRANSFORM: {
      uint32_t bits;
      if (!BrotliSafeReadBits(br, 1, &bits)) {
        h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_TRANSFORM;
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      if (bits != 0) {
        InverseMoveToFrontTransform(*context_map_arg, context_map_size, s);
      }
      h->substate_context_map = BROTLI_STATE_CONTEXT_MAP_NONE;
      return BROTLI_DECODER_SUCCESS;
    }

    default:
      return
          BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE);
  }
}